

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::PrepareVisitor::internalVisit(PrepareVisitor *this,RigidBody *rb)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined1 auVar3 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar4;
  PrepareVisitor *this_01;
  pointer ppAVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined1 local_68 [32];
  undefined1 local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  this_01 = (PrepareVisitor *)local_68;
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"VISITED","");
  StuntDouble::getPropertyByName((StuntDouble *)local_48,(string *)rb);
  p_Var6 = p_Stack_40;
  auVar3 = local_48;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = (undefined1  [8])0x0;
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (auVar3 != (undefined1  [8])0x0) {
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"VISITED","");
    StuntDouble::removeProperty(&rb->super_StuntDouble,(string *)local_68);
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)local_48,(string *)rb);
  this_00 = p_Stack_40;
  auVar3 = local_48;
  local_48 = (undefined1  [8])0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (auVar3 == (undefined1  [8])0x0) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    lVar4 = __dynamic_cast(auVar3,&GenericData::typeinfo,&AtomData::typeinfo,0);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((lVar4 != 0) &&
       (p_Var6 = this_00, this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (lVar4 != 0) {
      local_68._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"ATOMDATA","");
      StuntDouble::removeProperty(&rb->super_StuntDouble,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
    }
  }
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)local_68,&rb->atoms_);
  uVar2 = local_68._0_8_;
  for (ppAVar5 = (pointer)local_68._0_8_; ppAVar5 != (pointer)local_68._8_8_; ppAVar5 = ppAVar5 + 1)
  {
    internalVisit(this_01,*ppAVar5);
  }
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2,local_68._16_8_ - uVar2);
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void PrepareVisitor::internalVisit(RigidBody* rb) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::vector<Atom*> myAtoms;
    std::vector<Atom*>::iterator atomIter;

    // if visited property is  existed, remove it
    data = rb->getPropertyByName("VISITED");

    if (data != nullptr) { rb->removeProperty("VISITED"); }

    // remove atomdata
    data = rb->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData != NULL) rb->removeProperty("ATOMDATA");
    }

    myAtoms = rb->getAtoms();

    for (atomIter = myAtoms.begin(); atomIter != myAtoms.end(); ++atomIter)
      internalVisit(*atomIter);
  }